

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O3

void __thiscall
llvm::DWARFDebugLine::SectionParser::SectionParser
          (SectionParser *this,DWARFDataExtractor *Data,DWARFContext *C,cu_range CUs,tu_range TUs)

{
  DWARFDebugInfoEntry *pDVar1;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar2;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__begin1_1;
  DWARFUnit *pDVar3;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__begin1;
  Optional<unsigned_long> OVar4;
  anon_union_48_2_fc7899a5_for_OptionalStorage<llvm::DWARFFormValue,_true>_2 local_b8;
  char local_88;
  _Rb_tree_header *local_80;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFUnit_*>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
  local_78;
  undefined1 local_48 [8];
  DWARFDie CUDIE;
  
  local_80 = &(this->LineToUnit)._M_t._M_impl.super__Rb_tree_header;
  (this->LineToUnit)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LineToUnit)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LineToUnit)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &local_80->_M_header;
  (this->LineToUnit)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &local_80->_M_header;
  (this->LineToUnit)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->DebugLineData = Data;
  this->Context = C;
  this->Offset = 0;
  this->Done = false;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  CUDIE.Die = (DWARFDebugInfoEntry *)this;
  for (puVar2 = CUs.begin_iterator; puVar2 != CUs.end_iterator; puVar2 = puVar2 + 1) {
    pDVar3 = (puVar2->_M_t).
             super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
             super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
             super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
    DWARFUnit::extractDIEsIfNeeded(pDVar3,true);
    CUDIE.U = *(DWARFUnit **)
               &(pDVar3->DieArray).
                super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                ._M_impl.super__Vector_impl_data;
    if (CUDIE.U ==
        *(DWARFUnit **)
         ((long)&(pDVar3->DieArray).
                 super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
         + 8)) {
      pDVar3 = (DWARFUnit *)0x0;
      CUDIE.U = (DWARFUnit *)0x0;
    }
    local_48 = (undefined1  [8])pDVar3;
    if ((CUDIE.U != (DWARFUnit *)0x0 && pDVar3 != (DWARFUnit *)0x0) &&
       (DWARFDie::find((Optional<llvm::DWARFFormValue> *)&local_b8.value,(DWARFDie *)local_48,
                       DW_AT_stmt_list), local_88 != '\0')) {
      OVar4 = DWARFFormValue::getAsSectionOffset(&local_b8.value);
      if (((undefined1  [16])OVar4.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_b8.value.Value.field_0 =
             (anon_union_8_3_82d75f4a_for_ValueType_0)
             (puVar2->_M_t).
             super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
             super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
             super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
        local_b8._0_8_ = OVar4.Storage.field_0.value;
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,llvm::DWARFUnit*>,std::_Select1st<std::pair<unsigned_long_const,llvm::DWARFUnit*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,llvm::DWARFUnit*>>>
        ::_M_emplace_unique<std::pair<unsigned_long,llvm::DWARFUnit*>>
                  ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,llvm::DWARFUnit*>,std::_Select1st<std::pair<unsigned_long_const,llvm::DWARFUnit*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,llvm::DWARFUnit*>>>
                    *)&local_78,(pair<unsigned_long,_llvm::DWARFUnit_*> *)&local_b8.value);
      }
    }
  }
  if (TUs.begin_iterator != TUs.end_iterator) {
    do {
      pDVar3 = ((TUs.begin_iterator)->_M_t).
               super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
               super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
               super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
      DWARFUnit::extractDIEsIfNeeded(pDVar3,true);
      CUDIE.U = *(DWARFUnit **)
                 &(pDVar3->DieArray).
                  super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                  ._M_impl.super__Vector_impl_data;
      if (CUDIE.U ==
          *(DWARFUnit **)
           ((long)&(pDVar3->DieArray).
                   super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
           + 8)) {
        pDVar3 = (DWARFUnit *)0x0;
        CUDIE.U = (DWARFUnit *)0x0;
      }
      local_48 = (undefined1  [8])pDVar3;
      if ((CUDIE.U != (DWARFUnit *)0x0 && pDVar3 != (DWARFUnit *)0x0) &&
         (DWARFDie::find((Optional<llvm::DWARFFormValue> *)&local_b8.value,(DWARFDie *)local_48,
                         DW_AT_stmt_list), local_88 != '\0')) {
        OVar4 = DWARFFormValue::getAsSectionOffset(&local_b8.value);
        if (((undefined1  [16])OVar4.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_b8.value.Value.field_0 =
               (anon_union_8_3_82d75f4a_for_ValueType_0)
               ((TUs.begin_iterator)->_M_t).
               super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
               super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
               super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
          local_b8._0_8_ = OVar4.Storage.field_0.value;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,llvm::DWARFUnit*>,std::_Select1st<std::pair<unsigned_long_const,llvm::DWARFUnit*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,llvm::DWARFUnit*>>>
          ::_M_emplace_unique<std::pair<unsigned_long,llvm::DWARFUnit*>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,llvm::DWARFUnit*>,std::_Select1st<std::pair<unsigned_long_const,llvm::DWARFUnit*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,llvm::DWARFUnit*>>>
                      *)&local_78,(pair<unsigned_long,_llvm::DWARFUnit_*> *)&local_b8.value);
        }
      }
      TUs.begin_iterator = TUs.begin_iterator + 1;
    } while (TUs.begin_iterator != TUs.end_iterator);
  }
  pDVar1 = CUDIE.Die;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFUnit_*>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
  ::clear((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFUnit_*>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
           *)CUDIE.Die);
  if ((DWARFAbbreviationDeclaration *)local_78._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (DWARFAbbreviationDeclaration *)0x0) {
    pDVar1->Depth = local_78._M_impl.super__Rb_tree_header._M_header._M_color;
    pDVar1->AbbrevDecl =
         (DWARFAbbreviationDeclaration *)local_78._M_impl.super__Rb_tree_header._M_header._M_parent;
    pDVar1[1].Offset = (uint64_t)local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    *(_Base_ptr *)&pDVar1[1].Depth = local_78._M_impl.super__Rb_tree_header._M_header._M_right;
    (((AttributeSpecVector *)
     &(local_78._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->
    super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>).
    super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>.
    super_SmallVectorBase.BeginX = local_80;
    pDVar1[1].AbbrevDecl =
         (DWARFAbbreviationDeclaration *)local_78._M_impl.super__Rb_tree_header._M_node_count;
    local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_78._M_impl.super__Rb_tree_header._M_header;
    local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_right =
         local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFUnit_*>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
  ::~_Rb_tree(&local_78);
  if (*(DWARFAbbreviationDeclaration **)(pDVar1[2].Offset + 8) <= pDVar1[2].AbbrevDecl) {
    *(undefined1 *)&pDVar1[3].Offset = 1;
  }
  return;
}

Assistant:

DWARFDebugLine::SectionParser::SectionParser(DWARFDataExtractor &Data,
                                             const DWARFContext &C,
                                             cu_range CUs, tu_range TUs)
    : DebugLineData(Data), Context(C) {
  LineToUnit = buildLineToUnitMap(CUs, TUs);
  if (!DebugLineData.isValidOffset(Offset))
    Done = true;
}